

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [32];
  byte bVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined4 uVar12;
  int iVar13;
  undefined4 uVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  long lVar16;
  RayHitK<8> *pRVar17;
  uint uVar18;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  long lVar23;
  Scene *pSVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  Geometry *pGVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RayHitK<8> local_2889;
  ulong local_2888;
  undefined1 local_2880 [16];
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  size_t local_2848;
  RayHitK<8> *local_2840;
  Scene *local_2838;
  undefined1 local_2830 [16];
  undefined1 local_2820 [16];
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined1 local_27a0 [16];
  ulong local_2790;
  long local_2788;
  long local_2780;
  ulong local_2778;
  undefined1 *local_2770;
  void *local_2768;
  RTCRayQueryContext *local_2760;
  RayHitK<8> *local_2758;
  undefined1 (*local_2750) [32];
  undefined4 local_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  float local_2730;
  float fStack_272c;
  float fStack_2728;
  float fStack_2724;
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  RayHitK<8> *local_2700;
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined4 local_2460;
  undefined4 uStack_245c;
  undefined4 uStack_2458;
  undefined4 uStack_2454;
  undefined4 uStack_2450;
  undefined4 uStack_244c;
  undefined4 uStack_2448;
  undefined4 uStack_2444;
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined4 local_2420;
  undefined4 uStack_241c;
  undefined4 uStack_2418;
  undefined4 uStack_2414;
  undefined4 uStack_2410;
  undefined4 uStack_240c;
  undefined4 uStack_2408;
  undefined4 uStack_2404;
  uint local_2400;
  uint uStack_23fc;
  uint uStack_23f8;
  uint uStack_23f4;
  uint uStack_23f0;
  uint uStack_23ec;
  uint uStack_23e8;
  uint uStack_23e4;
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar19;
  
  pauVar37 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar14 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_24e0._4_4_ = uVar14;
  local_24e0._0_4_ = uVar14;
  local_24e0._8_4_ = uVar14;
  local_24e0._12_4_ = uVar14;
  local_24e0._16_4_ = uVar14;
  local_24e0._20_4_ = uVar14;
  local_24e0._24_4_ = uVar14;
  local_24e0._28_4_ = uVar14;
  auVar95 = ZEXT3264(local_24e0);
  uVar14 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = uVar14;
  local_2500._0_4_ = uVar14;
  local_2500._8_4_ = uVar14;
  local_2500._12_4_ = uVar14;
  local_2500._16_4_ = uVar14;
  local_2500._20_4_ = uVar14;
  local_2500._24_4_ = uVar14;
  local_2500._28_4_ = uVar14;
  auVar96 = ZEXT3264(local_2500);
  uVar14 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = uVar14;
  local_2520._0_4_ = uVar14;
  local_2520._8_4_ = uVar14;
  local_2520._12_4_ = uVar14;
  local_2520._16_4_ = uVar14;
  local_2520._20_4_ = uVar14;
  local_2520._24_4_ = uVar14;
  local_2520._28_4_ = uVar14;
  auVar103 = ZEXT3264(local_2520);
  fVar123 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar132 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar141 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar104 = fVar123 * 0.99999964;
  fVar112 = fVar132 * 0.99999964;
  fVar115 = fVar141 * 0.99999964;
  fVar123 = fVar123 * 1.0000004;
  fVar132 = fVar132 * 1.0000004;
  fVar141 = fVar141 * 1.0000004;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2778 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar36 = uVar32 ^ 0x20;
  uVar38 = uVar25 ^ 0x20;
  uVar35 = local_2778 ^ 0x20;
  iVar13 = (tray->tnear).field_0.i[k];
  local_2680._4_4_ = iVar13;
  local_2680._0_4_ = iVar13;
  local_2680._8_4_ = iVar13;
  local_2680._12_4_ = iVar13;
  local_2680._16_4_ = iVar13;
  local_2680._20_4_ = iVar13;
  local_2680._24_4_ = iVar13;
  local_2680._28_4_ = iVar13;
  auVar88 = ZEXT3264(local_2680);
  iVar13 = (tray->tfar).field_0.i[k];
  auVar47 = ZEXT3264(CONCAT428(iVar13,CONCAT424(iVar13,CONCAT420(iVar13,CONCAT416(iVar13,CONCAT412(
                                                  iVar13,CONCAT48(iVar13,CONCAT44(iVar13,iVar13)))))
                                               )));
  iVar13 = 1 << ((uint)k & 0x1f);
  auVar57._4_4_ = iVar13;
  auVar57._0_4_ = iVar13;
  auVar57._8_4_ = iVar13;
  auVar57._12_4_ = iVar13;
  auVar57._16_4_ = iVar13;
  auVar57._20_4_ = iVar13;
  auVar57._24_4_ = iVar13;
  auVar57._28_4_ = iVar13;
  auVar46 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar57 = vpand_avx2(auVar57,auVar46);
  local_2600 = vpcmpeqd_avx2(auVar57,auVar46);
  local_2540 = fVar104;
  fStack_253c = fVar104;
  fStack_2538 = fVar104;
  fStack_2534 = fVar104;
  fStack_2530 = fVar104;
  fStack_252c = fVar104;
  fStack_2528 = fVar104;
  fStack_2524 = fVar104;
  local_2560 = fVar112;
  fStack_255c = fVar112;
  fStack_2558 = fVar112;
  fStack_2554 = fVar112;
  fStack_2550 = fVar112;
  fStack_254c = fVar112;
  fStack_2548 = fVar112;
  fStack_2544 = fVar112;
  local_2580 = fVar115;
  fStack_257c = fVar115;
  fStack_2578 = fVar115;
  fStack_2574 = fVar115;
  fStack_2570 = fVar115;
  fStack_256c = fVar115;
  fStack_2568 = fVar115;
  fStack_2564 = fVar115;
  local_25a0 = fVar123;
  fStack_259c = fVar123;
  fStack_2598 = fVar123;
  fStack_2594 = fVar123;
  fStack_2590 = fVar123;
  fStack_258c = fVar123;
  fStack_2588 = fVar123;
  fStack_2584 = fVar123;
  local_25c0 = fVar132;
  fStack_25bc = fVar132;
  fStack_25b8 = fVar132;
  fStack_25b4 = fVar132;
  fStack_25b0 = fVar132;
  fStack_25ac = fVar132;
  fStack_25a8 = fVar132;
  fStack_25a4 = fVar132;
  local_25e0 = fVar141;
  fStack_25dc = fVar141;
  fStack_25d8 = fVar141;
  fStack_25d4 = fVar141;
  fStack_25d0 = fVar141;
  fStack_25cc = fVar141;
  fStack_25c8 = fVar141;
  fStack_25c4 = fVar141;
  fVar106 = fVar104;
  fVar107 = fVar104;
  fVar108 = fVar104;
  fVar109 = fVar104;
  fVar110 = fVar104;
  fVar111 = fVar104;
  fVar113 = fVar112;
  fVar142 = fVar112;
  fVar145 = fVar112;
  fVar147 = fVar112;
  fVar149 = fVar112;
  fVar114 = fVar112;
  fVar117 = fVar115;
  fVar118 = fVar115;
  fVar119 = fVar115;
  fVar120 = fVar115;
  fVar121 = fVar115;
  fVar122 = fVar115;
  fVar126 = fVar123;
  fVar127 = fVar123;
  fVar128 = fVar123;
  fVar129 = fVar123;
  fVar130 = fVar123;
  fVar131 = fVar123;
  fVar135 = fVar132;
  fVar136 = fVar132;
  fVar137 = fVar132;
  fVar138 = fVar132;
  fVar139 = fVar132;
  fVar140 = fVar132;
  fVar144 = fVar141;
  fVar146 = fVar141;
  fVar148 = fVar141;
  fVar150 = fVar141;
  fVar151 = fVar141;
  fVar152 = fVar141;
  local_2888 = uVar25;
  local_2848 = k;
  local_2840 = ray;
  local_2790 = uVar32;
LAB_016d0083:
  do {
    do {
      if (pauVar37 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar21 = pauVar37 + -1;
      pauVar37 = pauVar37 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar21 + 8));
    uVar22 = *(ulong *)*pauVar37;
    while ((uVar22 & 8) == 0) {
      uVar14 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar58._4_4_ = uVar14;
      auVar58._0_4_ = uVar14;
      auVar58._8_4_ = uVar14;
      auVar58._12_4_ = uVar14;
      auVar58._16_4_ = uVar14;
      auVar58._20_4_ = uVar14;
      auVar58._24_4_ = uVar14;
      auVar58._28_4_ = uVar14;
      uVar15 = uVar22 & 0xfffffffffffffff0;
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar32),auVar58,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar32));
      auVar57 = vsubps_avx(ZEXT1632(auVar48),auVar95._0_32_);
      auVar46._4_4_ = fVar106 * auVar57._4_4_;
      auVar46._0_4_ = fVar104 * auVar57._0_4_;
      auVar46._8_4_ = fVar107 * auVar57._8_4_;
      auVar46._12_4_ = fVar108 * auVar57._12_4_;
      auVar46._16_4_ = fVar109 * auVar57._16_4_;
      auVar46._20_4_ = fVar110 * auVar57._20_4_;
      auVar46._24_4_ = fVar111 * auVar57._24_4_;
      auVar46._28_4_ = auVar57._28_4_;
      auVar57 = vmaxps_avx(auVar88._0_32_,auVar46);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar25),auVar58,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar25));
      auVar46 = vsubps_avx(ZEXT1632(auVar48),auVar96._0_32_);
      auVar6._4_4_ = fVar113 * auVar46._4_4_;
      auVar6._0_4_ = fVar112 * auVar46._0_4_;
      auVar6._8_4_ = fVar142 * auVar46._8_4_;
      auVar6._12_4_ = fVar145 * auVar46._12_4_;
      auVar6._16_4_ = fVar147 * auVar46._16_4_;
      auVar6._20_4_ = fVar149 * auVar46._20_4_;
      auVar6._24_4_ = fVar114 * auVar46._24_4_;
      auVar6._28_4_ = auVar46._28_4_;
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + local_2778),auVar58,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + local_2778));
      auVar46 = vsubps_avx(ZEXT1632(auVar48),auVar103._0_32_);
      auVar8._4_4_ = fVar117 * auVar46._4_4_;
      auVar8._0_4_ = fVar115 * auVar46._0_4_;
      auVar8._8_4_ = fVar118 * auVar46._8_4_;
      auVar8._12_4_ = fVar119 * auVar46._12_4_;
      auVar8._16_4_ = fVar120 * auVar46._16_4_;
      auVar8._20_4_ = fVar121 * auVar46._20_4_;
      auVar8._24_4_ = fVar122 * auVar46._24_4_;
      auVar8._28_4_ = auVar46._28_4_;
      auVar46 = vmaxps_avx(auVar6,auVar8);
      local_24c0 = vmaxps_avx(auVar57,auVar46);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar36),auVar58,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar36));
      auVar57 = vsubps_avx(ZEXT1632(auVar48),auVar95._0_32_);
      auVar9._4_4_ = fVar126 * auVar57._4_4_;
      auVar9._0_4_ = fVar123 * auVar57._0_4_;
      auVar9._8_4_ = fVar127 * auVar57._8_4_;
      auVar9._12_4_ = fVar128 * auVar57._12_4_;
      auVar9._16_4_ = fVar129 * auVar57._16_4_;
      auVar9._20_4_ = fVar130 * auVar57._20_4_;
      auVar9._24_4_ = fVar131 * auVar57._24_4_;
      auVar9._28_4_ = auVar57._28_4_;
      auVar57 = vminps_avx(auVar47._0_32_,auVar9);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar38),auVar58,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar38));
      auVar46 = vsubps_avx(ZEXT1632(auVar48),auVar96._0_32_);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar35),auVar58,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar35));
      auVar10._4_4_ = fVar135 * auVar46._4_4_;
      auVar10._0_4_ = fVar132 * auVar46._0_4_;
      auVar10._8_4_ = fVar136 * auVar46._8_4_;
      auVar10._12_4_ = fVar137 * auVar46._12_4_;
      auVar10._16_4_ = fVar138 * auVar46._16_4_;
      auVar10._20_4_ = fVar139 * auVar46._20_4_;
      auVar10._24_4_ = fVar140 * auVar46._24_4_;
      auVar10._28_4_ = auVar46._28_4_;
      auVar46 = vsubps_avx(ZEXT1632(auVar48),auVar103._0_32_);
      auVar11._4_4_ = fVar144 * auVar46._4_4_;
      auVar11._0_4_ = fVar141 * auVar46._0_4_;
      auVar11._8_4_ = fVar146 * auVar46._8_4_;
      auVar11._12_4_ = fVar148 * auVar46._12_4_;
      auVar11._16_4_ = fVar150 * auVar46._16_4_;
      auVar11._20_4_ = fVar151 * auVar46._20_4_;
      auVar11._24_4_ = fVar152 * auVar46._24_4_;
      auVar11._28_4_ = auVar46._28_4_;
      auVar46 = vminps_avx(auVar10,auVar11);
      auVar57 = vminps_avx(auVar57,auVar46);
      auVar57 = vcmpps_avx(local_24c0,auVar57,2);
      if (((uint)uVar22 & 7) == 6) {
        auVar46 = vcmpps_avx(*(undefined1 (*) [32])(uVar15 + 0x1c0),auVar58,2);
        auVar6 = vcmpps_avx(auVar58,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
        auVar46 = vandps_avx(auVar46,auVar6);
        auVar57 = vandps_avx(auVar46,auVar57);
        auVar48 = vpackssdw_avx(auVar57._0_16_,auVar57._16_16_);
      }
      else {
        auVar48 = vpackssdw_avx(auVar57._0_16_,auVar57._16_16_);
      }
      auVar48 = vpsllw_avx(auVar48,0xf);
      if ((((((((auVar48 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar48 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar48 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar48 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar48[0xf])
      goto LAB_016d0083;
      auVar48 = vpacksswb_avx(auVar48,auVar48);
      bVar7 = SUB161(auVar48 >> 7,0) & 1 | (SUB161(auVar48 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar48 >> 0x17,0) & 1) << 2 | (SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar48 >> 0x27,0) & 1) << 4 | (SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar48 >> 0x37,0) & 1) << 6 | SUB161(auVar48 >> 0x3f,0) << 7;
      lVar16 = 0;
      for (uVar22 = (ulong)bVar7; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar16 = lVar16 + 1;
      }
      uVar22 = *(ulong *)(uVar15 + lVar16 * 8);
      uVar18 = bVar7 - 1 & (uint)bVar7;
      uVar19 = (ulong)uVar18;
      if (uVar18 != 0) {
        uVar4 = *(uint *)(local_24c0 + lVar16 * 4);
        lVar16 = 0;
        for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar18 = uVar18 - 1 & uVar18;
        uVar20 = (ulong)uVar18;
        uVar19 = *(ulong *)(uVar15 + lVar16 * 8);
        uVar5 = *(uint *)(local_24c0 + lVar16 * 4);
        uVar25 = local_2888;
        if (uVar18 == 0) {
          if (uVar4 < uVar5) {
            *(ulong *)*pauVar37 = uVar19;
            *(uint *)(*pauVar37 + 8) = uVar5;
            pauVar37 = pauVar37 + 1;
          }
          else {
            *(ulong *)*pauVar37 = uVar22;
            *(uint *)(*pauVar37 + 8) = uVar4;
            uVar22 = uVar19;
            pauVar37 = pauVar37 + 1;
          }
        }
        else {
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar22;
          auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar4));
          auVar60._8_8_ = 0;
          auVar60._0_8_ = uVar19;
          auVar60 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar5));
          lVar16 = 0;
          for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar18 = uVar18 - 1 & uVar18;
          uVar22 = (ulong)uVar18;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = *(ulong *)(uVar15 + lVar16 * 8);
          auVar49 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_24c0 + lVar16 * 4)));
          auVar64 = vpcmpgtd_avx(auVar60,auVar48);
          if (uVar18 == 0) {
            auVar75 = vpshufd_avx(auVar64,0xaa);
            auVar64 = vblendvps_avx(auVar60,auVar48,auVar75);
            auVar48 = vblendvps_avx(auVar48,auVar60,auVar75);
            auVar60 = vpcmpgtd_avx(auVar49,auVar64);
            auVar75 = vpshufd_avx(auVar60,0xaa);
            auVar60 = vblendvps_avx(auVar49,auVar64,auVar75);
            auVar64 = vblendvps_avx(auVar64,auVar49,auVar75);
            auVar49 = vpcmpgtd_avx(auVar64,auVar48);
            auVar75 = vpshufd_avx(auVar49,0xaa);
            auVar49 = vblendvps_avx(auVar64,auVar48,auVar75);
            auVar48 = vblendvps_avx(auVar48,auVar64,auVar75);
            *pauVar37 = auVar48;
            pauVar37[1] = auVar49;
            uVar22 = auVar60._0_8_;
            pauVar37 = pauVar37 + 2;
          }
          else {
            lVar16 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar18 = uVar18 - 1 & uVar18;
            uVar22 = (ulong)uVar18;
            auVar75._8_8_ = 0;
            auVar75._0_8_ = *(ulong *)(uVar15 + lVar16 * 8);
            auVar75 = vpunpcklqdq_avx(auVar75,ZEXT416(*(uint *)(local_24c0 + lVar16 * 4)));
            if (uVar18 == 0) {
              auVar52 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar60,auVar48,auVar52);
              auVar48 = vblendvps_avx(auVar48,auVar60,auVar52);
              auVar60 = vpcmpgtd_avx(auVar75,auVar49);
              auVar52 = vpshufd_avx(auVar60,0xaa);
              auVar60 = vblendvps_avx(auVar75,auVar49,auVar52);
              auVar49 = vblendvps_avx(auVar49,auVar75,auVar52);
              auVar75 = vpcmpgtd_avx(auVar49,auVar48);
              auVar52 = vpshufd_avx(auVar75,0xaa);
              auVar75 = vblendvps_avx(auVar49,auVar48,auVar52);
              auVar48 = vblendvps_avx(auVar48,auVar49,auVar52);
              auVar49 = vpcmpgtd_avx(auVar60,auVar64);
              auVar52 = vpshufd_avx(auVar49,0xaa);
              auVar49 = vblendvps_avx(auVar60,auVar64,auVar52);
              auVar60 = vblendvps_avx(auVar64,auVar60,auVar52);
              auVar64 = vpcmpgtd_avx(auVar75,auVar60);
              auVar52 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar75,auVar60,auVar52);
              auVar60 = vblendvps_avx(auVar60,auVar75,auVar52);
              *pauVar37 = auVar48;
              pauVar37[1] = auVar60;
              pauVar37[2] = auVar64;
              uVar22 = auVar49._0_8_;
              pauVar21 = pauVar37 + 3;
            }
            else {
              *pauVar37 = auVar48;
              pauVar37[1] = auVar60;
              pauVar37[2] = auVar49;
              pauVar21 = pauVar37 + 3;
              pauVar37[3] = auVar75;
              do {
                lVar16 = 0;
                for (uVar19 = uVar22; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000)
                {
                  lVar16 = lVar16 + 1;
                }
                auVar49._8_8_ = 0;
                auVar49._0_8_ = *(ulong *)(uVar15 + lVar16 * 8);
                auVar48 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_24c0 + lVar16 * 4)));
                pauVar21[1] = auVar48;
                pauVar21 = pauVar21 + 1;
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
              lVar16 = 0;
              while (pauVar21 != pauVar37) {
                uVar14 = *(undefined4 *)pauVar37[1];
                uVar3 = *(undefined4 *)(pauVar37[1] + 4);
                uVar18 = *(uint *)(pauVar37[1] + 8);
                uVar12 = *(undefined4 *)(pauVar37[1] + 0xc);
                for (lVar23 = 0x10;
                    (lVar16 != lVar23 && (*(uint *)(pauVar37[-1] + lVar23 + 8) < uVar18));
                    lVar23 = lVar23 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar37 + lVar23) =
                       *(undefined1 (*) [16])(pauVar37[-1] + lVar23);
                }
                puVar1 = (undefined4 *)(*pauVar37 + lVar23);
                *puVar1 = uVar14;
                puVar1[1] = uVar3;
                puVar1[2] = uVar18;
                puVar1[3] = uVar12;
                lVar16 = lVar16 + -0x10;
                pauVar37 = pauVar37 + 1;
              }
              uVar22 = *(ulong *)*pauVar21;
              k = local_2848;
              ray = local_2840;
            }
            auVar88 = ZEXT3264(local_2680);
            pauVar37 = pauVar21;
          }
        }
      }
    }
    local_2788 = (ulong)((uint)uVar22 & 0xf) - 8;
    uVar22 = uVar22 & 0xfffffffffffffff0;
    for (local_2780 = 0; local_2780 != local_2788; local_2780 = local_2780 + 1) {
      lVar33 = local_2780 * 0x50;
      pSVar24 = context->scene;
      pGVar34 = (pSVar24->geometries).items[*(uint *)(uVar22 + 0x30 + lVar33)].ptr;
      fVar123 = (pGVar34->time_range).lower;
      fVar123 = pGVar34->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar123) /
                ((pGVar34->time_range).upper - fVar123));
      auVar48 = vroundss_avx(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),9);
      auVar48 = vminss_avx(auVar48,ZEXT416((uint)(pGVar34->fnumTimeSegments + -1.0)));
      auVar61 = vmaxss_avx(ZEXT816(0),auVar48);
      lVar23 = (long)(int)auVar61._0_4_ * 0x38;
      uVar31 = (ulong)*(uint *)(uVar22 + 4 + lVar33);
      lVar16 = *(long *)(*(long *)&pGVar34[2].numPrimitives + lVar23);
      lVar23 = *(long *)(*(long *)&pGVar34[2].numPrimitives + 0x38 + lVar23);
      auVar48 = *(undefined1 (*) [16])(lVar16 + (ulong)*(uint *)(uVar22 + lVar33) * 4);
      uVar19 = (ulong)*(uint *)(uVar22 + 0x10 + lVar33);
      auVar60 = *(undefined1 (*) [16])(lVar16 + uVar19 * 4);
      uVar20 = (ulong)*(uint *)(uVar22 + 0x20 + lVar33);
      auVar67 = *(undefined1 (*) [16])(lVar16 + uVar20 * 4);
      auVar64 = *(undefined1 (*) [16])(lVar16 + uVar31 * 4);
      uVar26 = (ulong)*(uint *)(uVar22 + 0x14 + lVar33);
      auVar49 = *(undefined1 (*) [16])(lVar16 + uVar26 * 4);
      uVar27 = (ulong)*(uint *)(uVar22 + 0x24 + lVar33);
      auVar69 = *(undefined1 (*) [16])(lVar16 + uVar27 * 4);
      uVar28 = (ulong)*(uint *)(uVar22 + 8 + lVar33);
      auVar75 = *(undefined1 (*) [16])(lVar16 + uVar28 * 4);
      uVar25 = (ulong)*(uint *)(uVar22 + 0x18 + lVar33);
      auVar52 = *(undefined1 (*) [16])(lVar16 + uVar25 * 4);
      uVar29 = (ulong)*(uint *)(uVar22 + 0x28 + lVar33);
      auVar50 = *(undefined1 (*) [16])(lVar16 + uVar29 * 4);
      uVar30 = (ulong)*(uint *)(uVar22 + 0xc + lVar33);
      auVar42 = *(undefined1 (*) [16])(lVar16 + uVar30 * 4);
      uVar32 = (ulong)*(uint *)(uVar22 + 0x1c + lVar33);
      auVar40 = *(undefined1 (*) [16])(lVar16 + uVar32 * 4);
      uVar15 = (ulong)*(uint *)(uVar22 + 0x2c + lVar33);
      auVar39 = *(undefined1 (*) [16])(lVar16 + uVar15 * 4);
      auVar41 = *(undefined1 (*) [16])(lVar23 + (ulong)*(uint *)(uVar22 + lVar33) * 4);
      auVar51 = *(undefined1 (*) [16])(lVar23 + uVar19 * 4);
      fVar123 = fVar123 - auVar61._0_4_;
      auVar61 = vunpcklps_avx(auVar48,auVar75);
      auVar75 = vunpckhps_avx(auVar48,auVar75);
      auVar62 = vunpcklps_avx(auVar64,auVar42);
      auVar64 = vunpckhps_avx(auVar64,auVar42);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar31 * 4);
      auVar65 = vunpcklps_avx(auVar75,auVar64);
      auVar66 = vunpcklps_avx(auVar61,auVar62);
      auVar75 = vunpckhps_avx(auVar61,auVar62);
      auVar42 = vunpcklps_avx(auVar60,auVar52);
      auVar64 = vunpckhps_avx(auVar60,auVar52);
      auVar52 = vunpcklps_avx(auVar49,auVar40);
      auVar49 = vunpckhps_avx(auVar49,auVar40);
      auVar60 = *(undefined1 (*) [16])(lVar23 + uVar28 * 4);
      auVar40 = vunpcklps_avx(auVar64,auVar49);
      auVar61 = vunpcklps_avx(auVar42,auVar52);
      auVar49 = vunpckhps_avx(auVar42,auVar52);
      auVar42 = vunpcklps_avx(auVar67,auVar50);
      auVar52 = vunpckhps_avx(auVar67,auVar50);
      auVar62 = vunpcklps_avx(auVar69,auVar39);
      auVar50 = vunpckhps_avx(auVar69,auVar39);
      auVar64 = *(undefined1 (*) [16])(lVar23 + uVar30 * 4);
      auVar39 = vunpcklps_avx(auVar52,auVar50);
      auVar67 = vunpcklps_avx(auVar42,auVar62);
      auVar52 = vunpckhps_avx(auVar42,auVar62);
      auVar50 = vunpcklps_avx(auVar41,auVar60);
      auVar60 = vunpckhps_avx(auVar41,auVar60);
      auVar42 = vunpcklps_avx(auVar48,auVar64);
      auVar64 = vunpckhps_avx(auVar48,auVar64);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar25 * 4);
      auVar41 = vunpcklps_avx(auVar60,auVar64);
      auVar62 = vunpcklps_avx(auVar50,auVar42);
      auVar64 = vunpckhps_avx(auVar50,auVar42);
      auVar42 = vunpcklps_avx(auVar51,auVar48);
      auVar50 = vunpckhps_avx(auVar51,auVar48);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar26 * 4);
      auVar60 = *(undefined1 (*) [16])(lVar23 + uVar32 * 4);
      auVar51 = vunpcklps_avx(auVar48,auVar60);
      auVar48 = vunpckhps_avx(auVar48,auVar60);
      auVar69 = vunpcklps_avx(auVar50,auVar48);
      auVar68 = vunpcklps_avx(auVar42,auVar51);
      auVar50 = vunpckhps_avx(auVar42,auVar51);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar20 * 4);
      auVar60 = *(undefined1 (*) [16])(lVar23 + uVar29 * 4);
      auVar51 = vunpcklps_avx(auVar48,auVar60);
      auVar42 = vunpckhps_avx(auVar48,auVar60);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar27 * 4);
      auVar60 = *(undefined1 (*) [16])(lVar23 + uVar15 * 4);
      auVar70 = vunpcklps_avx(auVar48,auVar60);
      auVar48 = vunpckhps_avx(auVar48,auVar60);
      auVar60 = vunpcklps_avx(auVar42,auVar48);
      auVar42 = vunpcklps_avx(auVar51,auVar70);
      auVar48 = vunpckhps_avx(auVar51,auVar70);
      fVar132 = 1.0 - fVar123;
      auVar116._4_4_ = fVar132;
      auVar116._0_4_ = fVar132;
      auVar116._8_4_ = fVar132;
      auVar116._12_4_ = fVar132;
      auVar80._0_4_ = fVar123 * auVar62._0_4_;
      auVar80._4_4_ = fVar123 * auVar62._4_4_;
      auVar80._8_4_ = fVar123 * auVar62._8_4_;
      auVar80._12_4_ = fVar123 * auVar62._12_4_;
      auVar51 = vfmadd231ps_fma(auVar80,auVar116,auVar66);
      auVar97._0_4_ = fVar123 * auVar64._0_4_;
      auVar97._4_4_ = fVar123 * auVar64._4_4_;
      auVar97._8_4_ = fVar123 * auVar64._8_4_;
      auVar97._12_4_ = fVar123 * auVar64._12_4_;
      auVar64 = vfmadd231ps_fma(auVar97,auVar116,auVar75);
      auVar89._0_4_ = fVar123 * auVar41._0_4_;
      auVar89._4_4_ = fVar123 * auVar41._4_4_;
      auVar89._8_4_ = fVar123 * auVar41._8_4_;
      auVar89._12_4_ = fVar123 * auVar41._12_4_;
      auVar75 = vfmadd231ps_fma(auVar89,auVar116,auVar65);
      auVar76._0_4_ = fVar123 * auVar68._0_4_;
      auVar76._4_4_ = fVar123 * auVar68._4_4_;
      auVar76._8_4_ = fVar123 * auVar68._8_4_;
      auVar76._12_4_ = fVar123 * auVar68._12_4_;
      auVar41 = vfmadd231ps_fma(auVar76,auVar116,auVar61);
      auVar68._0_4_ = fVar123 * auVar50._0_4_;
      auVar68._4_4_ = fVar123 * auVar50._4_4_;
      auVar68._8_4_ = fVar123 * auVar50._8_4_;
      auVar68._12_4_ = fVar123 * auVar50._12_4_;
      auVar49 = vfmadd231ps_fma(auVar68,auVar116,auVar49);
      puVar2 = (undefined8 *)(uVar22 + 0x30 + lVar33);
      local_2610 = *puVar2;
      uStack_2608 = puVar2[1];
      puVar2 = (undefined8 *)(uVar22 + 0x40 + lVar33);
      auVar50._0_4_ = fVar123 * auVar69._0_4_;
      auVar50._4_4_ = fVar123 * auVar69._4_4_;
      auVar50._8_4_ = fVar123 * auVar69._8_4_;
      auVar50._12_4_ = fVar123 * auVar69._12_4_;
      auVar50 = vfmadd231ps_fma(auVar50,auVar116,auVar40);
      auVar61._0_4_ = fVar123 * auVar42._0_4_;
      auVar61._4_4_ = fVar123 * auVar42._4_4_;
      auVar61._8_4_ = fVar123 * auVar42._8_4_;
      auVar61._12_4_ = fVar123 * auVar42._12_4_;
      auVar65._0_4_ = fVar123 * auVar48._0_4_;
      auVar65._4_4_ = fVar123 * auVar48._4_4_;
      auVar65._8_4_ = fVar123 * auVar48._8_4_;
      auVar65._12_4_ = fVar123 * auVar48._12_4_;
      auVar105._0_4_ = fVar123 * auVar60._0_4_;
      auVar105._4_4_ = fVar123 * auVar60._4_4_;
      auVar105._8_4_ = fVar123 * auVar60._8_4_;
      auVar105._12_4_ = fVar123 * auVar60._12_4_;
      auVar42 = vfmadd231ps_fma(auVar61,auVar116,auVar67);
      auVar52 = vfmadd231ps_fma(auVar65,auVar116,auVar52);
      auVar40 = vfmadd231ps_fma(auVar105,auVar116,auVar39);
      local_2740 = *puVar2;
      uStack_2738 = puVar2[1];
      uVar14 = *(undefined4 *)(local_2840 + local_2848 * 4);
      auVar39._4_4_ = uVar14;
      auVar39._0_4_ = uVar14;
      auVar39._8_4_ = uVar14;
      auVar39._12_4_ = uVar14;
      uVar14 = *(undefined4 *)(local_2840 + local_2848 * 4 + 0x20);
      auVar124._4_4_ = uVar14;
      auVar124._0_4_ = uVar14;
      auVar124._8_4_ = uVar14;
      auVar124._12_4_ = uVar14;
      uVar14 = *(undefined4 *)(local_2840 + local_2848 * 4 + 0x40);
      auVar133._4_4_ = uVar14;
      auVar133._0_4_ = uVar14;
      auVar133._8_4_ = uVar14;
      auVar133._12_4_ = uVar14;
      local_2810 = vsubps_avx(auVar51,auVar39);
      local_27a0 = vsubps_avx(auVar64,auVar124);
      local_2820 = vsubps_avx(auVar75,auVar133);
      auVar48 = vsubps_avx(auVar41,auVar39);
      auVar60 = vsubps_avx(auVar49,auVar124);
      auVar64 = vsubps_avx(auVar50,auVar133);
      auVar49 = vsubps_avx(auVar42,auVar39);
      auVar75 = vsubps_avx(auVar52,auVar124);
      auVar52 = vsubps_avx(auVar40,auVar133);
      local_2830 = vsubps_avx(auVar49,local_2810);
      local_27c0 = vsubps_avx(auVar75,local_27a0);
      local_27b0 = vsubps_avx(auVar52,local_2820);
      auVar40._0_4_ = auVar49._0_4_ + local_2810._0_4_;
      auVar40._4_4_ = auVar49._4_4_ + local_2810._4_4_;
      auVar40._8_4_ = auVar49._8_4_ + local_2810._8_4_;
      auVar40._12_4_ = auVar49._12_4_ + local_2810._12_4_;
      auVar66._0_4_ = auVar75._0_4_ + local_27a0._0_4_;
      auVar66._4_4_ = auVar75._4_4_ + local_27a0._4_4_;
      auVar66._8_4_ = auVar75._8_4_ + local_27a0._8_4_;
      auVar66._12_4_ = auVar75._12_4_ + local_27a0._12_4_;
      fVar132 = local_2820._0_4_;
      auVar69._0_4_ = auVar52._0_4_ + fVar132;
      fVar141 = local_2820._4_4_;
      auVar69._4_4_ = auVar52._4_4_ + fVar141;
      fVar104 = local_2820._8_4_;
      auVar69._8_4_ = auVar52._8_4_ + fVar104;
      fVar112 = local_2820._12_4_;
      auVar69._12_4_ = auVar52._12_4_ + fVar112;
      auVar125._0_4_ = local_27b0._0_4_ * auVar66._0_4_;
      auVar125._4_4_ = local_27b0._4_4_ * auVar66._4_4_;
      auVar125._8_4_ = local_27b0._8_4_ * auVar66._8_4_;
      auVar125._12_4_ = local_27b0._12_4_ * auVar66._12_4_;
      auVar42 = vfmsub231ps_fma(auVar125,local_27c0,auVar69);
      auVar70._0_4_ = local_2830._0_4_ * auVar69._0_4_;
      auVar70._4_4_ = local_2830._4_4_ * auVar69._4_4_;
      auVar70._8_4_ = local_2830._8_4_ * auVar69._8_4_;
      auVar70._12_4_ = local_2830._12_4_ * auVar69._12_4_;
      auVar50 = vfmsub231ps_fma(auVar70,local_27b0,auVar40);
      auVar41._0_4_ = local_27c0._0_4_ * auVar40._0_4_;
      auVar41._4_4_ = local_27c0._4_4_ * auVar40._4_4_;
      auVar41._8_4_ = local_27c0._8_4_ * auVar40._8_4_;
      auVar41._12_4_ = local_27c0._12_4_ * auVar40._12_4_;
      auVar40 = vfmsub231ps_fma(auVar41,local_2830,auVar66);
      fVar123 = *(float *)(local_2840 + local_2848 * 4 + 0xc0);
      auVar62._0_4_ = fVar123 * auVar40._0_4_;
      auVar62._4_4_ = fVar123 * auVar40._4_4_;
      auVar62._8_4_ = fVar123 * auVar40._8_4_;
      auVar62._12_4_ = fVar123 * auVar40._12_4_;
      uVar14 = *(undefined4 *)(local_2840 + local_2848 * 4 + 0xa0);
      auVar98._4_4_ = uVar14;
      auVar98._0_4_ = uVar14;
      auVar98._8_4_ = uVar14;
      auVar98._12_4_ = uVar14;
      auVar50 = vfmadd231ps_fma(auVar62,auVar98,auVar50);
      uVar14 = *(undefined4 *)(local_2840 + local_2848 * 4 + 0x80);
      auVar134._4_4_ = uVar14;
      auVar134._0_4_ = uVar14;
      auVar134._8_4_ = uVar14;
      auVar134._12_4_ = uVar14;
      local_2620 = vfmadd231ps_fma(auVar50,auVar134,auVar42);
      local_27d0 = vsubps_avx(local_27a0,auVar60);
      local_27f0 = vsubps_avx(local_2820,auVar64);
      auVar67._0_4_ = local_27a0._0_4_ + auVar60._0_4_;
      auVar67._4_4_ = local_27a0._4_4_ + auVar60._4_4_;
      auVar67._8_4_ = local_27a0._8_4_ + auVar60._8_4_;
      auVar67._12_4_ = local_27a0._12_4_ + auVar60._12_4_;
      auVar71._0_4_ = auVar64._0_4_ + fVar132;
      auVar71._4_4_ = auVar64._4_4_ + fVar141;
      auVar71._8_4_ = auVar64._8_4_ + fVar104;
      auVar71._12_4_ = auVar64._12_4_ + fVar112;
      fVar115 = local_27f0._0_4_;
      auVar81._0_4_ = auVar67._0_4_ * fVar115;
      fVar107 = local_27f0._4_4_;
      auVar81._4_4_ = auVar67._4_4_ * fVar107;
      fVar109 = local_27f0._8_4_;
      auVar81._8_4_ = auVar67._8_4_ * fVar109;
      fVar111 = local_27f0._12_4_;
      auVar81._12_4_ = auVar67._12_4_ * fVar111;
      auVar42 = vfmsub231ps_fma(auVar81,local_27d0,auVar71);
      local_27e0 = vsubps_avx(local_2810,auVar48);
      fVar142 = local_27e0._0_4_;
      auVar90._0_4_ = fVar142 * auVar71._0_4_;
      fVar145 = local_27e0._4_4_;
      auVar90._4_4_ = fVar145 * auVar71._4_4_;
      fVar147 = local_27e0._8_4_;
      auVar90._8_4_ = fVar147 * auVar71._8_4_;
      fVar149 = local_27e0._12_4_;
      auVar90._12_4_ = fVar149 * auVar71._12_4_;
      auVar72._0_4_ = local_2810._0_4_ + auVar48._0_4_;
      auVar72._4_4_ = local_2810._4_4_ + auVar48._4_4_;
      auVar72._8_4_ = local_2810._8_4_ + auVar48._8_4_;
      auVar72._12_4_ = local_2810._12_4_ + auVar48._12_4_;
      auVar50 = vfmsub231ps_fma(auVar90,local_27f0,auVar72);
      fVar106 = local_27d0._0_4_;
      auVar73._0_4_ = auVar72._0_4_ * fVar106;
      fVar108 = local_27d0._4_4_;
      auVar73._4_4_ = auVar72._4_4_ * fVar108;
      fVar110 = local_27d0._8_4_;
      auVar73._8_4_ = auVar72._8_4_ * fVar110;
      fVar113 = local_27d0._12_4_;
      auVar73._12_4_ = auVar72._12_4_ * fVar113;
      auVar40 = vfmsub231ps_fma(auVar73,local_27e0,auVar67);
      auVar74._0_4_ = fVar123 * auVar40._0_4_;
      auVar74._4_4_ = fVar123 * auVar40._4_4_;
      auVar74._8_4_ = fVar123 * auVar40._8_4_;
      auVar74._12_4_ = fVar123 * auVar40._12_4_;
      auVar50 = vfmadd231ps_fma(auVar74,auVar98,auVar50);
      local_2720 = vfmadd231ps_fma(auVar50,auVar134,auVar42);
      auVar50 = vsubps_avx(auVar48,auVar49);
      auVar82._0_4_ = auVar49._0_4_ + auVar48._0_4_;
      auVar82._4_4_ = auVar49._4_4_ + auVar48._4_4_;
      auVar82._8_4_ = auVar49._8_4_ + auVar48._8_4_;
      auVar82._12_4_ = auVar49._12_4_ + auVar48._12_4_;
      auVar49 = vsubps_avx(auVar60,auVar75);
      auVar42._0_4_ = auVar60._0_4_ + auVar75._0_4_;
      auVar42._4_4_ = auVar60._4_4_ + auVar75._4_4_;
      auVar42._8_4_ = auVar60._8_4_ + auVar75._8_4_;
      auVar42._12_4_ = auVar60._12_4_ + auVar75._12_4_;
      auVar75 = vsubps_avx(auVar64,auVar52);
      auVar51._0_4_ = auVar64._0_4_ + auVar52._0_4_;
      auVar51._4_4_ = auVar64._4_4_ + auVar52._4_4_;
      auVar51._8_4_ = auVar64._8_4_ + auVar52._8_4_;
      auVar51._12_4_ = auVar64._12_4_ + auVar52._12_4_;
      auVar91._0_4_ = auVar42._0_4_ * auVar75._0_4_;
      auVar91._4_4_ = auVar42._4_4_ * auVar75._4_4_;
      auVar91._8_4_ = auVar42._8_4_ * auVar75._8_4_;
      auVar91._12_4_ = auVar42._12_4_ * auVar75._12_4_;
      auVar60 = vfmsub231ps_fma(auVar91,auVar49,auVar51);
      auVar52._0_4_ = auVar51._0_4_ * auVar50._0_4_;
      auVar52._4_4_ = auVar51._4_4_ * auVar50._4_4_;
      auVar52._8_4_ = auVar51._8_4_ * auVar50._8_4_;
      auVar52._12_4_ = auVar51._12_4_ * auVar50._12_4_;
      auVar48 = vfmsub231ps_fma(auVar52,auVar75,auVar82);
      auVar83._0_4_ = auVar49._0_4_ * auVar82._0_4_;
      auVar83._4_4_ = auVar49._4_4_ * auVar82._4_4_;
      auVar83._8_4_ = auVar49._8_4_ * auVar82._8_4_;
      auVar83._12_4_ = auVar49._12_4_ * auVar82._12_4_;
      auVar64 = vfmsub231ps_fma(auVar83,auVar50,auVar42);
      auVar84._0_4_ = fVar123 * auVar64._0_4_;
      auVar84._4_4_ = fVar123 * auVar64._4_4_;
      auVar84._8_4_ = fVar123 * auVar64._8_4_;
      auVar84._12_4_ = fVar123 * auVar64._12_4_;
      auVar48 = vfmadd231ps_fma(auVar84,auVar98,auVar48);
      auVar64 = vfmadd231ps_fma(auVar48,auVar134,auVar60);
      local_2730 = local_2620._0_4_;
      fStack_272c = local_2620._4_4_;
      fStack_2728 = local_2620._8_4_;
      fStack_2724 = local_2620._12_4_;
      local_2710._0_4_ = auVar64._0_4_ + local_2730 + local_2720._0_4_;
      local_2710._4_4_ = auVar64._4_4_ + fStack_272c + local_2720._4_4_;
      local_2710._8_4_ = auVar64._8_4_ + fStack_2728 + local_2720._8_4_;
      local_2710._12_4_ = auVar64._12_4_ + fStack_2724 + local_2720._12_4_;
      auVar143._8_4_ = 0x7fffffff;
      auVar143._0_8_ = 0x7fffffff7fffffff;
      auVar143._12_4_ = 0x7fffffff;
      auVar48 = vminps_avx(local_2620,local_2720);
      auVar48 = vminps_avx(auVar48,auVar64);
      local_2630 = vandps_avx(local_2710,auVar143);
      auVar99._0_4_ = local_2630._0_4_ * 1.1920929e-07;
      auVar99._4_4_ = local_2630._4_4_ * 1.1920929e-07;
      auVar99._8_4_ = local_2630._8_4_ * 1.1920929e-07;
      auVar99._12_4_ = local_2630._12_4_ * 1.1920929e-07;
      uVar25 = CONCAT44(auVar99._4_4_,auVar99._0_4_);
      auVar92._0_8_ = uVar25 ^ 0x8000000080000000;
      auVar92._8_4_ = -auVar99._8_4_;
      auVar92._12_4_ = -auVar99._12_4_;
      auVar48 = vcmpps_avx(auVar48,auVar92,5);
      auVar60 = vmaxps_avx(local_2620,local_2720);
      auVar60 = vmaxps_avx(auVar60,auVar64);
      auVar60 = vcmpps_avx(auVar60,auVar99,2);
      local_2880 = vorps_avx(auVar48,auVar60);
      k = local_2848;
      ray = local_2840;
      if ((((local_2880 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (local_2880 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (local_2880 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          local_2880[0xf] < '\0') {
        auVar53._0_4_ = fVar106 * local_27b0._0_4_;
        auVar53._4_4_ = fVar108 * local_27b0._4_4_;
        auVar53._8_4_ = fVar110 * local_27b0._8_4_;
        auVar53._12_4_ = fVar113 * local_27b0._12_4_;
        auVar85._0_4_ = fVar142 * local_27c0._0_4_;
        auVar85._4_4_ = fVar145 * local_27c0._4_4_;
        auVar85._8_4_ = fVar147 * local_27c0._8_4_;
        auVar85._12_4_ = fVar149 * local_27c0._12_4_;
        auVar64 = vfmsub213ps_fma(local_27c0,local_27f0,auVar53);
        auVar93._0_4_ = auVar49._0_4_ * fVar115;
        auVar93._4_4_ = auVar49._4_4_ * fVar107;
        auVar93._8_4_ = auVar49._8_4_ * fVar109;
        auVar93._12_4_ = auVar49._12_4_ * fVar111;
        auVar100._0_4_ = fVar142 * auVar75._0_4_;
        auVar100._4_4_ = fVar145 * auVar75._4_4_;
        auVar100._8_4_ = fVar147 * auVar75._8_4_;
        auVar100._12_4_ = fVar149 * auVar75._12_4_;
        auVar75 = vfmsub213ps_fma(auVar75,local_27d0,auVar93);
        auVar48 = vandps_avx(auVar143,auVar53);
        auVar60 = vandps_avx(auVar143,auVar93);
        auVar48 = vcmpps_avx(auVar48,auVar60,1);
        local_26b0 = vblendvps_avx(auVar75,auVar64,auVar48);
        auVar77._0_4_ = fVar106 * auVar50._0_4_;
        auVar77._4_4_ = fVar108 * auVar50._4_4_;
        auVar77._8_4_ = fVar110 * auVar50._8_4_;
        auVar77._12_4_ = fVar113 * auVar50._12_4_;
        auVar64 = vfmsub213ps_fma(auVar50,local_27f0,auVar100);
        auVar94._0_4_ = local_2830._0_4_ * fVar115;
        auVar94._4_4_ = local_2830._4_4_ * fVar107;
        auVar94._8_4_ = local_2830._8_4_ * fVar109;
        auVar94._12_4_ = local_2830._12_4_ * fVar111;
        auVar75 = vfmsub213ps_fma(local_27b0,local_27e0,auVar94);
        auVar48 = vandps_avx(auVar143,auVar94);
        auVar60 = vandps_avx(auVar100,auVar143);
        auVar48 = vcmpps_avx(auVar48,auVar60,1);
        local_26a0 = vblendvps_avx(auVar64,auVar75,auVar48);
        auVar64 = vfmsub213ps_fma(local_2830,local_27d0,auVar85);
        auVar49 = vfmsub213ps_fma(auVar49,local_27e0,auVar77);
        auVar48 = vandps_avx(auVar143,auVar85);
        auVar60 = vandps_avx(auVar143,auVar77);
        auVar48 = vcmpps_avx(auVar48,auVar60,1);
        local_2690 = vblendvps_avx(auVar49,auVar64,auVar48);
        auVar78._0_4_ = local_2690._0_4_ * fVar123;
        auVar78._4_4_ = local_2690._4_4_ * fVar123;
        auVar78._8_4_ = local_2690._8_4_ * fVar123;
        auVar78._12_4_ = local_2690._12_4_ * fVar123;
        auVar48 = vfmadd213ps_fma(auVar98,local_26a0,auVar78);
        auVar48 = vfmadd213ps_fma(auVar134,local_26b0,auVar48);
        auVar79._0_4_ = auVar48._0_4_ + auVar48._0_4_;
        auVar79._4_4_ = auVar48._4_4_ + auVar48._4_4_;
        auVar79._8_4_ = auVar48._8_4_ + auVar48._8_4_;
        auVar79._12_4_ = auVar48._12_4_ + auVar48._12_4_;
        auVar86._0_4_ = local_2690._0_4_ * fVar132;
        auVar86._4_4_ = local_2690._4_4_ * fVar141;
        auVar86._8_4_ = local_2690._8_4_ * fVar104;
        auVar86._12_4_ = local_2690._12_4_ * fVar112;
        auVar48 = vfmadd213ps_fma(local_27a0,local_26a0,auVar86);
        auVar60 = vfmadd213ps_fma(local_2810,local_26b0,auVar48);
        auVar48 = vrcpps_avx(auVar79);
        auVar101._8_4_ = 0x3f800000;
        auVar101._0_8_ = 0x3f8000003f800000;
        auVar101._12_4_ = 0x3f800000;
        auVar64 = vfnmadd213ps_fma(auVar48,auVar79,auVar101);
        auVar48 = vfmadd132ps_fma(auVar64,auVar48,auVar48);
        local_26c0._0_4_ = auVar48._0_4_ * (auVar60._0_4_ + auVar60._0_4_);
        local_26c0._4_4_ = auVar48._4_4_ * (auVar60._4_4_ + auVar60._4_4_);
        local_26c0._8_4_ = auVar48._8_4_ * (auVar60._8_4_ + auVar60._8_4_);
        local_26c0._12_4_ = auVar48._12_4_ * (auVar60._12_4_ + auVar60._12_4_);
        auVar47 = ZEXT1664(local_26c0);
        uVar14 = *(undefined4 *)(local_2840 + local_2848 * 4 + 0x60);
        auVar87._4_4_ = uVar14;
        auVar87._0_4_ = uVar14;
        auVar87._8_4_ = uVar14;
        auVar87._12_4_ = uVar14;
        auVar48 = vcmpps_avx(auVar87,local_26c0,2);
        uVar14 = *(undefined4 *)(local_2840 + local_2848 * 4 + 0x100);
        auVar102._4_4_ = uVar14;
        auVar102._0_4_ = uVar14;
        auVar102._8_4_ = uVar14;
        auVar102._12_4_ = uVar14;
        auVar88 = ZEXT1664(auVar102);
        auVar60 = vcmpps_avx(local_26c0,auVar102,2);
        auVar48 = vandps_avx(auVar48,auVar60);
        auVar64 = local_2880 & auVar48;
        if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar64[0xf] < '\0') {
          auVar48 = vandps_avx(auVar48,local_2880);
          auVar64 = vcmpps_avx(auVar79,_DAT_01f45a50,4);
          auVar49 = auVar64 & auVar48;
          if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar49[0xf] < '\0') {
            local_2800 = vandps_avx(auVar48,auVar64);
            pRVar17 = &local_2889;
            local_2700 = pRVar17;
            local_26f0 = local_2800;
            auVar48 = vrcpps_avx(local_2710);
            auVar63._8_4_ = 0x3f800000;
            auVar63._0_8_ = 0x3f8000003f800000;
            auVar63._12_4_ = 0x3f800000;
            auVar64 = vfnmadd213ps_fma(local_2710,auVar48,auVar63);
            auVar64 = vfmadd132ps_fma(auVar64,auVar48,auVar48);
            auVar54._8_4_ = 0x219392ef;
            auVar54._0_8_ = 0x219392ef219392ef;
            auVar54._12_4_ = 0x219392ef;
            auVar48 = vcmpps_avx(local_2630,auVar54,5);
            auVar48 = vandps_avx(auVar64,auVar48);
            auVar43._0_4_ = local_2730 * auVar48._0_4_;
            auVar43._4_4_ = fStack_272c * auVar48._4_4_;
            auVar43._8_4_ = fStack_2728 * auVar48._8_4_;
            auVar43._12_4_ = fStack_2724 * auVar48._12_4_;
            local_26e0 = vminps_avx(auVar43,auVar63);
            auVar44._0_4_ = auVar48._0_4_ * local_2720._0_4_;
            auVar44._4_4_ = auVar48._4_4_ * local_2720._4_4_;
            auVar44._8_4_ = auVar48._8_4_ * local_2720._8_4_;
            auVar44._12_4_ = auVar48._12_4_ * local_2720._12_4_;
            local_26d0 = vminps_avx(auVar44,auVar63);
            auVar55._8_4_ = 0x7f800000;
            auVar55._0_8_ = 0x7f8000007f800000;
            auVar55._12_4_ = 0x7f800000;
            auVar48 = vblendvps_avx(auVar55,local_26c0,local_2800);
            auVar64 = vshufps_avx(auVar48,auVar48,0xb1);
            auVar64 = vminps_avx(auVar64,auVar48);
            auVar49 = vshufpd_avx(auVar64,auVar64,1);
            auVar64 = vminps_avx(auVar49,auVar64);
            auVar48 = vcmpps_avx(auVar48,auVar64,0);
            auVar49 = local_2800 & auVar48;
            auVar64 = vpcmpeqd_avx(auVar64,auVar64);
            if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar49[0xf] < '\0') {
              auVar64 = auVar48;
            }
            auVar48 = vandps_avx(local_2800,auVar64);
            auVar57 = vpcmpeqd_avx2(ZEXT1632(auVar60),ZEXT1632(auVar60));
            auVar95 = ZEXT3264(auVar57);
            local_2838 = pSVar24;
            do {
              auVar48 = vpslld_avx(auVar48,0x1f);
              uVar14 = vmovmskps_avx(auVar48);
              lVar16 = 0;
              for (uVar25 = CONCAT44((int)((ulong)pRVar17 >> 0x20),uVar14); (uVar25 & 1) == 0;
                  uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                lVar16 = lVar16 + 1;
              }
              local_2400 = *(uint *)((long)&local_2610 + lVar16 * 4);
              pRVar17 = (RayHitK<8> *)(ulong)local_2400;
              pGVar34 = (pSVar24->geometries).items[(long)pRVar17].ptr;
              if ((pGVar34->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_2800 + lVar16 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar34->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar25 = (ulong)(uint)((int)lVar16 << 2);
                  uVar14 = *(undefined4 *)(local_26e0 + uVar25);
                  uVar3 = *(undefined4 *)(local_26d0 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_26c0 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_26b0 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_26a0 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2690 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar14;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)((long)&local_2740 + uVar25)
                  ;
                  *(uint *)(ray + k * 4 + 0x240) = local_2400;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                uVar25 = (ulong)(uint)((int)lVar16 * 4);
                local_2460 = *(undefined4 *)(local_26e0 + uVar25);
                local_2440 = *(undefined4 *)(local_26d0 + uVar25);
                local_2420 = *(undefined4 *)((long)&local_2740 + uVar25);
                uVar14 = *(undefined4 *)(local_26b0 + uVar25);
                local_24c0._4_4_ = uVar14;
                local_24c0._0_4_ = uVar14;
                local_24c0._8_4_ = uVar14;
                local_24c0._12_4_ = uVar14;
                local_24c0._16_4_ = uVar14;
                local_24c0._20_4_ = uVar14;
                local_24c0._24_4_ = uVar14;
                local_24c0._28_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_26a0 + uVar25);
                local_24a0._4_4_ = uVar14;
                local_24a0._0_4_ = uVar14;
                local_24a0._8_4_ = uVar14;
                local_24a0._12_4_ = uVar14;
                local_24a0._16_4_ = uVar14;
                local_24a0._20_4_ = uVar14;
                local_24a0._24_4_ = uVar14;
                local_24a0._28_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_2690 + uVar25);
                local_2480._4_4_ = uVar14;
                local_2480._0_4_ = uVar14;
                local_2480._8_4_ = uVar14;
                local_2480._12_4_ = uVar14;
                local_2480._16_4_ = uVar14;
                local_2480._20_4_ = uVar14;
                local_2480._24_4_ = uVar14;
                local_2480._28_4_ = uVar14;
                uStack_245c = local_2460;
                uStack_2458 = local_2460;
                uStack_2454 = local_2460;
                uStack_2450 = local_2460;
                uStack_244c = local_2460;
                uStack_2448 = local_2460;
                uStack_2444 = local_2460;
                uStack_243c = local_2440;
                uStack_2438 = local_2440;
                uStack_2434 = local_2440;
                uStack_2430 = local_2440;
                uStack_242c = local_2440;
                uStack_2428 = local_2440;
                uStack_2424 = local_2440;
                uStack_241c = local_2420;
                uStack_2418 = local_2420;
                uStack_2414 = local_2420;
                uStack_2410 = local_2420;
                uStack_240c = local_2420;
                uStack_2408 = local_2420;
                uStack_2404 = local_2420;
                uStack_23fc = local_2400;
                uStack_23f8 = local_2400;
                uStack_23f4 = local_2400;
                uStack_23f0 = local_2400;
                uStack_23ec = local_2400;
                uStack_23e8 = local_2400;
                uStack_23e4 = local_2400;
                uStack_23dc = context->user->instID[0];
                local_23e0 = uStack_23dc;
                uStack_23d8 = uStack_23dc;
                uStack_23d4 = uStack_23dc;
                uStack_23d0 = uStack_23dc;
                uStack_23cc = uStack_23dc;
                uStack_23c8 = uStack_23dc;
                uStack_23c4 = uStack_23dc;
                uStack_23bc = context->user->instPrimID[0];
                local_23c0 = uStack_23bc;
                uStack_23b8 = uStack_23bc;
                uStack_23b4 = uStack_23bc;
                uStack_23b0 = uStack_23bc;
                uStack_23ac = uStack_23bc;
                uStack_23a8 = uStack_23bc;
                uStack_23a4 = uStack_23bc;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_26c0 + uVar25);
                local_2660 = local_2600;
                local_2770 = local_2660;
                local_2768 = pGVar34->userPtr;
                local_2760 = context->user;
                local_2750 = &local_24c0;
                local_2748 = 8;
                pRVar17 = (RayHitK<8> *)pGVar34->intersectionFilterN;
                local_2758 = ray;
                if (pRVar17 != (RayHitK<8> *)0x0) {
                  local_2880._0_8_ = lVar16;
                  local_2860 = auVar47._0_16_;
                  local_2870 = auVar88._0_16_;
                  local_2810._0_8_ = pGVar34;
                  auVar57 = ZEXT1632(auVar95._0_16_);
                  pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)(&local_2770);
                  auVar88 = ZEXT1664(local_2870);
                  auVar47 = ZEXT1664(local_2860);
                  auVar57 = vpcmpeqd_avx2(auVar57,auVar57);
                  auVar95 = ZEXT3264(auVar57);
                  pSVar24 = local_2838;
                  lVar16 = local_2880._0_8_;
                  k = local_2848;
                  ray = local_2840;
                  pGVar34 = (Geometry *)local_2810._0_8_;
                }
                auVar46 = vpcmpeqd_avx2(local_2660,_DAT_01f7b000);
                auVar57 = auVar95._0_32_ & ~auVar46;
                if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar57 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar57 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar57 >> 0x7f,0) == '\0') &&
                      (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar57 >> 0xbf,0) == '\0') &&
                    (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar57[0x1f]) {
                  auVar46 = auVar46 ^ auVar95._0_32_;
                }
                else {
                  pRVar17 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar17 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar34->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    local_2880._0_8_ = lVar16;
                    local_2860 = auVar47._0_16_;
                    local_2870 = auVar88._0_16_;
                    auVar57 = ZEXT1632(auVar95._0_16_);
                    pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)(&local_2770);
                    auVar88 = ZEXT1664(local_2870);
                    auVar47 = ZEXT1664(local_2860);
                    auVar57 = vpcmpeqd_avx2(auVar57,auVar57);
                    auVar95 = ZEXT3264(auVar57);
                    pSVar24 = local_2838;
                    lVar16 = local_2880._0_8_;
                    k = local_2848;
                    ray = local_2840;
                  }
                  auVar6 = vpcmpeqd_avx2(local_2660,_DAT_01f7b000);
                  auVar46 = auVar6 ^ auVar95._0_32_;
                  auVar57 = auVar95._0_32_ & ~auVar6;
                  if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar57 >> 0x7f,0) != '\0') ||
                        (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar57 >> 0xbf,0) != '\0') ||
                      (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar57[0x1f] < '\0') {
                    auVar59._0_4_ = auVar6._0_4_ ^ auVar95._0_4_;
                    auVar59._4_4_ = auVar6._4_4_ ^ auVar95._4_4_;
                    auVar59._8_4_ = auVar6._8_4_ ^ auVar95._8_4_;
                    auVar59._12_4_ = auVar6._12_4_ ^ auVar95._12_4_;
                    auVar59._16_4_ = auVar6._16_4_ ^ auVar95._16_4_;
                    auVar59._20_4_ = auVar6._20_4_ ^ auVar95._20_4_;
                    auVar59._24_4_ = auVar6._24_4_ ^ auVar95._24_4_;
                    auVar59._28_4_ = auVar6._28_4_ ^ auVar95._28_4_;
                    auVar57 = vmaskmovps_avx(auVar59,*local_2750);
                    *(undefined1 (*) [32])(local_2758 + 0x180) = auVar57;
                    auVar57 = vmaskmovps_avx(auVar59,local_2750[1]);
                    *(undefined1 (*) [32])(local_2758 + 0x1a0) = auVar57;
                    auVar57 = vmaskmovps_avx(auVar59,local_2750[2]);
                    *(undefined1 (*) [32])(local_2758 + 0x1c0) = auVar57;
                    auVar57 = vmaskmovps_avx(auVar59,local_2750[3]);
                    *(undefined1 (*) [32])(local_2758 + 0x1e0) = auVar57;
                    auVar57 = vmaskmovps_avx(auVar59,local_2750[4]);
                    *(undefined1 (*) [32])(local_2758 + 0x200) = auVar57;
                    auVar57 = vpmaskmovd_avx2(auVar59,local_2750[5]);
                    *(undefined1 (*) [32])(local_2758 + 0x220) = auVar57;
                    auVar57 = vpmaskmovd_avx2(auVar59,local_2750[6]);
                    *(undefined1 (*) [32])(local_2758 + 0x240) = auVar57;
                    auVar57 = vpmaskmovd_avx2(auVar59,local_2750[7]);
                    *(undefined1 (*) [32])(local_2758 + 0x260) = auVar57;
                    auVar57 = vpmaskmovd_avx2(auVar59,local_2750[8]);
                    *(undefined1 (*) [32])(local_2758 + 0x280) = auVar57;
                    pRVar17 = local_2758;
                  }
                }
                if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar46 >> 0x7f,0) == '\0') &&
                      (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar46 >> 0xbf,0) == '\0') &&
                    (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar46[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar88._0_4_;
                }
                else {
                  auVar88 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_2800 + lVar16 * 4) = 0;
                uVar14 = auVar88._0_4_;
                auVar45._4_4_ = uVar14;
                auVar45._0_4_ = uVar14;
                auVar45._8_4_ = uVar14;
                auVar45._12_4_ = uVar14;
                auVar48 = vcmpps_avx(auVar47._0_16_,auVar45,2);
                local_2800 = vandps_avx(auVar48,local_2800);
              }
              if ((((local_2800 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2800 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2800 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2800[0xf]) break;
              auVar56._8_4_ = 0x7f800000;
              auVar56._0_8_ = 0x7f8000007f800000;
              auVar56._12_4_ = 0x7f800000;
              auVar48 = vblendvps_avx(auVar56,auVar47._0_16_,local_2800);
              auVar60 = vshufps_avx(auVar48,auVar48,0xb1);
              auVar60 = vminps_avx(auVar60,auVar48);
              auVar64 = vshufpd_avx(auVar60,auVar60,1);
              auVar60 = vminps_avx(auVar64,auVar60);
              auVar60 = vcmpps_avx(auVar48,auVar60,0);
              auVar64 = local_2800 & auVar60;
              auVar48 = local_2800;
              if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar64[0xf] < '\0') {
                auVar48 = vandps_avx(auVar60,local_2800);
              }
              auVar48 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar48);
            } while( true );
          }
        }
      }
      auVar95 = ZEXT3264(local_24e0);
      auVar96 = ZEXT3264(local_2500);
      auVar103 = ZEXT3264(local_2520);
      auVar88 = ZEXT3264(local_2680);
      uVar25 = local_2888;
      uVar32 = local_2790;
      fVar104 = local_2540;
      fVar106 = fStack_253c;
      fVar107 = fStack_2538;
      fVar108 = fStack_2534;
      fVar109 = fStack_2530;
      fVar110 = fStack_252c;
      fVar111 = fStack_2528;
      fVar112 = local_2560;
      fVar113 = fStack_255c;
      fVar142 = fStack_2558;
      fVar145 = fStack_2554;
      fVar147 = fStack_2550;
      fVar149 = fStack_254c;
      fVar114 = fStack_2548;
      fVar115 = local_2580;
      fVar117 = fStack_257c;
      fVar118 = fStack_2578;
      fVar119 = fStack_2574;
      fVar120 = fStack_2570;
      fVar121 = fStack_256c;
      fVar122 = fStack_2568;
      fVar123 = local_25a0;
      fVar126 = fStack_259c;
      fVar127 = fStack_2598;
      fVar128 = fStack_2594;
      fVar129 = fStack_2590;
      fVar130 = fStack_258c;
      fVar131 = fStack_2588;
      fVar132 = local_25c0;
      fVar135 = fStack_25bc;
      fVar136 = fStack_25b8;
      fVar137 = fStack_25b4;
      fVar138 = fStack_25b0;
      fVar139 = fStack_25ac;
      fVar140 = fStack_25a8;
      fVar141 = local_25e0;
      fVar144 = fStack_25dc;
      fVar146 = fStack_25d8;
      fVar148 = fStack_25d4;
      fVar150 = fStack_25d0;
      fVar151 = fStack_25cc;
      fVar152 = fStack_25c8;
    }
    uVar14 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar47 = ZEXT3264(CONCAT428(uVar14,CONCAT424(uVar14,CONCAT420(uVar14,CONCAT416(uVar14,CONCAT412
                                                  (uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }